

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
ptc::(anonymous_namespace)::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,duration<long,_std::ratio<1L,_1L>_> *val
          )

{
  rep rVar1;
  ostream *poVar2;
  duration<long,_std::ratio<1L,_1L>_> *val_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(val);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,rVar1);
  std::operator<<(poVar2,'s');
  return os;
}

Assistant:

std::basic_ostream<T_str>& operator <<( std::basic_ostream<T_str>& os, const std::chrono::duration<int_type, T_time>& val )
     {
      if constexpr( ! std::is_same_v<std::chrono::duration<int_type, T_time>, std::chrono::duration<int_type>> )
       {
        static std::unordered_map<std::type_index, std::basic_string_view<T_str>> time_map
         {
          { typeid( std::nano ), StringConverter<T_str>( "ns" ) },
          { typeid( std::micro ), StringConverter<T_str>( "us" ) },
          { typeid( std::milli ), StringConverter<T_str>( "ms" ) },
          { typeid( std::ratio<60> ), StringConverter<T_str>( "min" ) },
          { typeid( std::ratio<3600> ), StringConverter<T_str>( "h" ) }
         };
  
        #if ( __cplusplus >= 202002L )
        time_map.insert( { typeid( std::ratio<86400> ), StringConverter<T_str>( "d" ) } );
        time_map.insert( { typeid( std::ratio<604800> ), StringConverter<T_str>( "w" ) } );
        time_map.insert( { typeid( std::ratio<2629746> ), StringConverter<T_str>( "mos" ) } );
        time_map.insert( { typeid( std::ratio<31556952> ), StringConverter<T_str>( "y" ) } );
        #endif
         
        os << val.count() << time_map[ typeid( T_time ) ];
       }
      else if constexpr( std::is_same_v<std::chrono::duration<int_type, T_time>, std::chrono::duration<int_type>> )
       {
        os << val.count() << 's';
       }
  
      return os;
     }